

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

CapTypes __thiscall ON_CurvePiping::CapType(ON_CurvePiping *this)

{
  ON_InternalXMLImpl *this_00;
  bool bVar1;
  CapTypes CVar2;
  ON_wString s;
  undefined1 local_210 [256];
  ON_XMLVariant local_110;
  
  this_00 = &((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_110,L"");
  ON_InternalXMLImpl::GetParameter
            ((ON_XMLVariant *)(local_210 + 8),this_00,L"",L"cap-type",&local_110);
  ::ON_XMLVariant::AsString((ON_XMLVariant *)local_210);
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)(local_210 + 8));
  ::ON_XMLVariant::~ON_XMLVariant(&local_110);
  bVar1 = ::operator==((ON_wString *)local_210,L"flat");
  CVar2 = Flat;
  if (!bVar1) {
    bVar1 = ::operator==((ON_wString *)local_210,L"box");
    CVar2 = Box;
    if (!bVar1) {
      bVar1 = ::operator==((ON_wString *)local_210,L"dome");
      CVar2 = (uint)bVar1 + (uint)bVar1 * 2;
    }
  }
  ON_wString::~ON_wString((ON_wString *)local_210);
  return CVar2;
}

Assistant:

ON_CurvePiping::CapTypes ON_CurvePiping::CapType(void) const
{
  const ON_wString s = m_impl->GetParameter(ON_CURVE_PIPING_CAP_TYPE, L"").AsString();

  if (s == ON_CURVE_PIPING_FLAT) return ON_CurvePiping::CapTypes::Flat;
  if (s == ON_CURVE_PIPING_BOX)  return ON_CurvePiping::CapTypes::Box;
  if (s == ON_CURVE_PIPING_DOME) return ON_CurvePiping::CapTypes::Dome;

  return ON_CurvePiping::CapTypes::None;
}